

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction.cpp
# Opt level: O0

Instruction * Instruction::get(Addr addr,int size)

{
  mapped_type pIVar1;
  int size_00;
  Addr addr_00;
  mapped_type *ppIVar2;
  Instruction *this;
  allocator local_41;
  string local_40 [32];
  mapped_type local_20;
  Instruction *instr;
  Addr AStack_10;
  int size_local;
  Addr addr_local;
  
  instr._4_4_ = size;
  AStack_10 = addr;
  ppIVar2 = std::
            map<unsigned_long,_Instruction_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Instruction_*>_>_>
            ::operator[](&m_instrsMap,&stack0xfffffffffffffff0);
  local_20 = *ppIVar2;
  if (local_20 == (mapped_type)0x0) {
    this = (Instruction *)operator_new(0x38);
    addr_00 = AStack_10;
    size_00 = instr._4_4_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"???",&local_41);
    Instruction(this,addr_00,size_00,(string *)local_40);
    local_20 = this;
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    pIVar1 = local_20;
    ppIVar2 = std::
              map<unsigned_long,_Instruction_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Instruction_*>_>_>
              ::operator[](&m_instrsMap,&stack0xfffffffffffffff0);
    *ppIVar2 = pIVar1;
  }
  else if (local_20->m_size == 0) {
    local_20->m_size = instr._4_4_;
  }
  else if (local_20->m_size != instr._4_4_) {
    __assert_fail("instr->m_size == size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cmpcfgs/src/Instruction.cpp"
                  ,0x2d,"static Instruction *Instruction::get(Addr, int)");
  }
  return local_20;
}

Assistant:

Instruction* Instruction::get(Addr addr, int size) {
	Instruction* instr = m_instrsMap[addr];
	if (instr) {
		if (instr->m_size == 0)
			instr->m_size = size;
		else
			assert(instr->m_size == size);
	} else {
		instr = new Instruction(addr, size);
		m_instrsMap[addr] = instr;
	}

	return instr;
}